

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  bool bVar1;
  Type type;
  AssertHelper *this_00;
  int *in_RDI;
  AssertionResult gtest_ar;
  int i;
  int numParticles;
  ParticleArray particles;
  ConstParticleRef in_stack_ffffffffffffff48;
  ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff80;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  int local_28;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x215609);
  for (local_28 = 0; local_28 < 0xc; local_28 = local_28 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (in_stack_ffffffffffffff80);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::pushBack
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  type = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::size
                   ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x215689);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI,
             (int *)in_stack_ffffffffffffff50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x2156df)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff80,type,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x21572d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21578d);
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x2157ac);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}